

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O1

image<crnlib::color_quad<unsigned_char,_int>_> * __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::operator=
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,
          image<crnlib::color_quad<unsigned_char,_int>_> *other)

{
  pixel_buf_t *this_00;
  uint uVar1;
  color_quad<unsigned_char,_int> *__src;
  color_quad<unsigned_char,_int> *pcVar2;
  uint uVar3;
  ulong uVar4;
  
  if (this == other) {
    return this;
  }
  uVar3 = (other->m_pixel_buf).m_size;
  if (uVar3 == 0) {
    uVar3 = other->m_height * other->m_pitch;
    if ((uVar3 == 0) || (other->m_pPixels == (color_quad<unsigned_char,_int> *)0x0)) {
      pcVar2 = (this->m_pixel_buf).m_p;
      if (pcVar2 != (color_quad<unsigned_char,_int> *)0x0) {
        crnlib_free(pcVar2);
        (this->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
        (this->m_pixel_buf).m_size = 0;
        (this->m_pixel_buf).m_capacity = 0;
      }
      pcVar2 = (color_quad<unsigned_char,_int> *)0x0;
      goto LAB_00108b92;
    }
    uVar1 = (this->m_pixel_buf).m_size;
    if (uVar1 != uVar3) {
      if ((uVar1 <= uVar3) && ((this->m_pixel_buf).m_capacity < uVar3)) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_pixel_buf,uVar3,uVar1 + 1 == uVar3,4,
                   (object_mover)0x0,false);
      }
      (this->m_pixel_buf).m_size = uVar3;
    }
    uVar3 = (this->m_pixel_buf).m_size;
    uVar4 = (ulong)uVar3;
    if (uVar4 != 0) {
      pcVar2 = other->m_pPixels;
      uVar1 = uVar3 * 2;
      if ((-1 < (int)uVar3) && ((this->m_pixel_buf).m_capacity < uVar1)) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_pixel_buf,uVar1,true,4,(object_mover)0x0,false);
      }
      (this->m_pixel_buf).m_size = uVar1;
      __src = (this->m_pixel_buf).m_p;
      memmove(__src + uVar4,__src,uVar4 << 2);
      memcpy((this->m_pixel_buf).m_p,pcVar2,uVar4 << 2);
    }
  }
  else {
    this_00 = &this->m_pixel_buf;
    if (this != other) {
      if ((this->m_pixel_buf).m_capacity < uVar3) {
        if (this_00->m_p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(this_00->m_p);
          this_00->m_p = (color_quad<unsigned_char,_int> *)0x0;
          (this->m_pixel_buf).m_size = 0;
          (this->m_pixel_buf).m_capacity = 0;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,(other->m_pixel_buf).m_size,false,4,(object_mover)0x0
                   ,false);
      }
      else if ((this->m_pixel_buf).m_size != 0) {
        (this->m_pixel_buf).m_size = 0;
      }
      memcpy((this->m_pixel_buf).m_p,(other->m_pixel_buf).m_p,
             (ulong)(other->m_pixel_buf).m_size << 2);
      (this->m_pixel_buf).m_size = (other->m_pixel_buf).m_size;
    }
  }
  pcVar2 = (this->m_pixel_buf).m_p;
LAB_00108b92:
  this->m_pPixels = pcVar2;
  this->m_width = other->m_width;
  this->m_height = other->m_height;
  this->m_pitch = other->m_pitch;
  this->m_total = other->m_total;
  this->m_comp_flags = other->m_comp_flags;
  return this;
}

Assistant:

image& operator=(const image& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (other.m_pixel_buf.empty())
            {
                // This doesn't look very safe - let's make a new instance.
                //m_pixel_buf.clear();
                //m_pPixels = other.m_pPixels;

                const uint total_pixels = other.m_pitch * other.m_height;
                if ((total_pixels) && (other.m_pPixels))
                {
                    m_pixel_buf.resize(total_pixels);
                    m_pixel_buf.insert(0, other.m_pPixels, m_pixel_buf.size());
                    m_pPixels = &m_pixel_buf.front();
                }
                else
                {
                    m_pixel_buf.clear();
                    m_pPixels = nullptr;
                }
            }
            else
            {
                m_pixel_buf = other.m_pixel_buf;
                m_pPixels = &m_pixel_buf.front();
            }

            m_width = other.m_width;
            m_height = other.m_height;
            m_pitch = other.m_pitch;
            m_total = other.m_total;
            m_comp_flags = other.m_comp_flags;

            return *this;
        }